

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

void __thiscall re2::NFA::~NFA(NFA *this)

{
  Thread *pTVar1;
  Thread *pTVar2;
  
  if (this->match_ != (char **)0x0) {
    operator_delete__(this->match_);
  }
  if (this->astack_ != (AddState *)0x0) {
    operator_delete__(this->astack_);
  }
  pTVar2 = this->free_threads_;
  while (pTVar2 != (Thread *)0x0) {
    pTVar1 = (pTVar2->field_0).next;
    if (pTVar2->capture != (char **)0x0) {
      operator_delete__(pTVar2->capture);
    }
    operator_delete(pTVar2);
    pTVar2 = pTVar1;
  }
  SparseArray<re2::NFA::Thread_*>::~SparseArray(&this->q1_);
  SparseArray<re2::NFA::Thread_*>::~SparseArray(&this->q0_);
  return;
}

Assistant:

NFA::~NFA() {
  delete[] match_;
  delete[] astack_;
  Thread* next;
  for (Thread* t = free_threads_; t; t = next) {
    next = t->next;
    delete[] t->capture;
    delete t;
  }
}